

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O2

int flatcc_verify_struct_as_nested_root
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
              char *fid,size_t size,uint16_t align)

{
  int iVar1;
  uint *puVar2;
  undefined6 in_register_0000008a;
  ulong elem_size;
  
  elem_size = CONCAT62(in_register_0000008a,align) & 0xffffffff;
  iVar1 = flatcc_verify_vector_field(td,id,required,elem_size,1,0xffffffff);
  if (iVar1 != 0) {
    iVar1 = flatcc_verify_vector_field(td,id,required,elem_size,1,0xffffffff);
    return iVar1;
  }
  puVar2 = (uint *)get_field_ptr(td,id);
  if (puVar2 != (uint *)0x0) {
    iVar1 = flatcc_verify_struct_as_root
                      ((void *)((long)puVar2 + (ulong)*puVar2 + 4),
                       (ulong)*(uint *)((ulong)*puVar2 + (long)puVar2),fid,size,align);
    return iVar1;
  }
  return 0;
}

Assistant:

int flatcc_verify_struct_as_nested_root(flatcc_table_verifier_descriptor_t *td,
        voffset_t id, int required, const char *fid, size_t size, uint16_t align)
{
    const uoffset_t *buf;
    uoffset_t bufsiz;

    check_result(flatcc_verify_vector_field(td, id, required, align, 1, FLATBUFFERS_COUNT_MAX(1)));
    if (0 == (buf = get_field_ptr(td, id))) {
        return flatcc_verify_ok;
    }
    buf = (const uoffset_t *)((size_t)buf + read_uoffset(buf, 0));
    bufsiz = read_uoffset(buf, 0);
    ++buf;
    return flatcc_verify_struct_as_root(buf, bufsiz, fid, size, align);
}